

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void Catch::prepareExpandedExpression(AssertionResult *result)

{
  string local_30;
  AssertionResult *local_10;
  AssertionResult *result_local;
  
  local_10 = result;
  AssertionResult::getExpandedExpression_abi_cxx11_(&local_30,result);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void prepareExpandedExpression(AssertionResult& result) {
        result.getExpandedExpression();
    }